

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructOrUnionDeclaration_Struct.cpp
# Opt level: O1

ostream * psy::C::operator<<(ostream *os,StructDeclarationSymbol *strukt)

{
  ScopeKind K;
  TagType *tagTy;
  Scope *this;
  long lVar1;
  char *pcVar2;
  FieldDeclarationSymbol **fld;
  pointer ppFVar3;
  Fields local_38;
  
  if (strukt == (StructDeclarationSymbol *)0x0) {
    pcVar2 = "<Struct is null>";
    lVar1 = 0x10;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<Struct |",9);
    std::__ostream_insert<char,std::char_traits<char>>(os," type:",6);
    tagTy = TagDeclarationSymbol::introducedNewType((TagDeclarationSymbol *)strukt);
    operator<<(os,tagTy);
    std::__ostream_insert<char,std::char_traits<char>>(os," scope:",7);
    this = DeclarationSymbol::enclosingScope((DeclarationSymbol *)strukt);
    K = Scope::kind(this);
    operator<<(os,K);
    StructOrUnionDeclarationSymbol::fields(&local_38,&strukt->super_StructOrUnionDeclarationSymbol);
    for (ppFVar3 = local_38.
                   super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar3 !=
        local_38.
        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(os," field:",7);
      operator<<(os,*ppFVar3);
    }
    if (local_38.
        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StructDeclarationSymbol* strukt)
{
    if (!strukt)
        return os << "<Struct is null>";
    os << "<Struct |";
    os << " type:" << strukt->introducedNewType();
    os << " scope:" << strukt->enclosingScope()->kind();
    for (const auto& fld : strukt->fields())
        os << " field:" << fld;
    os << ">";
    return os;
}